

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

void Vertical_Sweep_Span(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ushort uVar1;
  PByte puVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  lVar12 = (long)worker->precision;
  uVar4 = (lVar12 + x1) - 1U & -lVar12;
  uVar11 = -lVar12 & x2;
  if ((left->flags & 7) != 2) {
    uVar8 = uVar4;
    if (uVar4 == x1) {
      uVar8 = uVar11;
    }
    if (uVar11 == x2) {
      uVar8 = uVar11;
    }
    if (x2 - (lVar12 + x1) <= (long)worker->precision_jitter) {
      uVar11 = uVar8;
    }
  }
  bVar9 = (byte)worker->precision_bits;
  lVar12 = (long)uVar4 >> (bVar9 & 0x3f);
  uVar11 = (long)uVar11 >> (bVar9 & 0x3f);
  if (-1 < (long)uVar11) {
    uVar1 = worker->bWidth;
    if (lVar12 < (long)(ulong)uVar1) {
      uVar6 = 0;
      if (0 < lVar12) {
        uVar6 = (uint)lVar12;
      }
      uVar3 = uVar1 - 1;
      if (uVar11 < uVar1) {
        uVar3 = (uint)uVar11;
      }
      uVar7 = uVar6 >> 3;
      uVar11 = (ulong)uVar7;
      bVar10 = 0xff >> ((byte)uVar6 & 7);
      iVar13 = (int)(short)(uVar3 >> 3);
      bVar9 = -0x80 >> ((byte)uVar3 & 7);
      puVar2 = worker->bLine;
      pbVar5 = puVar2 + uVar11;
      if ((int)uVar7 < iVar13) {
        *pbVar5 = *pbVar5 | bVar10;
        if (iVar13 - uVar7 != 1) {
          uVar4 = (ulong)((iVar13 - uVar7) - 2);
          memset(puVar2 + uVar11 + 1,0xff,uVar4 + 1);
          pbVar5 = puVar2 + uVar4 + uVar11 + 1;
        }
        pbVar5 = pbVar5 + 1;
      }
      else {
        bVar9 = bVar9 & bVar10;
      }
      *pbVar5 = *pbVar5 | bVar9;
    }
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Span( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long  e1, e2;

    Int  dropOutControl = left->flags & 7;

    FT_UNUSED( y );
    FT_UNUSED( left );
    FT_UNUSED( right );


    /* in high-precision mode, we need 12 digits after the comma to */
    /* represent multiples of 1/(1<<12) = 1/4096                    */
    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    e1 = CEILING( x1 );
    e2 = FLOOR( x2 );

    /* take care of the special case where both the left */
    /* and right contour lie exactly on pixel centers    */
    if ( dropOutControl != 2                             &&
         x2 - x1 - ras.precision <= ras.precision_jitter &&
         e1 != x1 && e2 != x2                            )
      e2 = e1;

    e1 = TRUNC( e1 );
    e2 = TRUNC( e2 );

    if ( e2 >= 0 && e1 < ras.bWidth )
    {
      Byte*  target;

      Int   c1, c2;
      Byte  f1, f2;


      if ( e1 < 0 )
        e1 = 0;
      if ( e2 >= ras.bWidth )
        e2 = ras.bWidth - 1;

      FT_TRACE7(( " -> x=[%ld;%ld]", e1, e2 ));

      c1 = (Short)( e1 >> 3 );
      c2 = (Short)( e2 >> 3 );

      f1 = (Byte)  ( 0xFF >> ( e1 & 7 ) );
      f2 = (Byte) ~( 0x7F >> ( e2 & 7 ) );

      target = ras.bLine + c1;
      c2 -= c1;

      if ( c2 > 0 )
      {
        target[0] |= f1;

        /* memset() is slower than the following code on many platforms. */
        /* This is due to the fact that, in the vast majority of cases,  */
        /* the span length in bytes is relatively small.                 */
        while ( --c2 > 0 )
          *( ++target ) = 0xFF;

        target[1] |= f2;
      }
      else
        *target |= ( f1 & f2 );
    }

    FT_TRACE7(( "\n" ));
  }